

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# container.cpp
# Opt level: O3

void mountDirectories(Container *container)

{
  pointer pcVar1;
  Verbosity VVar2;
  int iVar3;
  runtime_error *prVar4;
  int *piVar5;
  long *plVar6;
  long *plVar7;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  size_type *local_b0;
  string containerDir;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  string local_50;
  
  pcVar1 = (container->dir)._M_dataplus._M_p;
  local_b0 = &containerDir._M_string_length;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_b0,pcVar1,pcVar1 + (container->dir)._M_string_length);
  VVar2 = loguru::current_verbosity_cutoff();
  if (-1 < VVar2) {
    loguru::log((double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da));
  }
  iVar3 = mount("proc","/proc","proc",0,(void *)0x0);
  if (iVar3 != 0) {
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    piVar5 = __errno_location();
    std::__cxx11::to_string(&local_50,*piVar5);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&containerDir.field_2 + 8),"Mount /proc: FAILED [Errno ",&local_50);
    plVar6 = (long *)std::__cxx11::string::append(containerDir.field_2._M_local_buf + 8);
    local_70 = (long *)*plVar6;
    plVar7 = plVar6 + 2;
    if (local_70 == plVar7) {
      local_60 = *plVar7;
      lStack_58 = plVar6[3];
      local_70 = &local_60;
    }
    else {
      local_60 = *plVar7;
    }
    local_68 = plVar6[1];
    *plVar6 = (long)plVar7;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    std::runtime_error::runtime_error(prVar4,(string *)&local_70);
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  iVar3 = mount("sysfs","/sys","sysfs",0,(void *)0x0);
  if (iVar3 != 0) {
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    piVar5 = __errno_location();
    std::__cxx11::to_string(&local_50,*piVar5);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&containerDir.field_2 + 8),"Mount /sys: FAILED [Errno ",&local_50);
    plVar6 = (long *)std::__cxx11::string::append(containerDir.field_2._M_local_buf + 8);
    local_70 = (long *)*plVar6;
    plVar7 = plVar6 + 2;
    if (local_70 == plVar7) {
      local_60 = *plVar7;
      lStack_58 = plVar6[3];
      local_70 = &local_60;
    }
    else {
      local_60 = *plVar7;
    }
    local_68 = plVar6[1];
    *plVar6 = (long)plVar7;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    std::runtime_error::runtime_error(prVar4,(string *)&local_70);
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  iVar3 = mount("tmpfs","/dev","tmpfs",0x1000002,(void *)0x0);
  if (iVar3 == 0) {
    VVar2 = loguru::current_verbosity_cutoff();
    if (-1 < VVar2) {
      loguru::log((double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00));
    }
    if (local_b0 != &containerDir._M_string_length) {
      operator_delete(local_b0,containerDir._M_string_length + 1);
    }
    return;
  }
  prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
  piVar5 = __errno_location();
  std::__cxx11::to_string(&local_50,*piVar5);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&containerDir.field_2 + 8),"Mount /dev: FAILED [Errno ",&local_50);
  plVar6 = (long *)std::__cxx11::string::append(containerDir.field_2._M_local_buf + 8);
  local_70 = (long *)*plVar6;
  plVar7 = plVar6 + 2;
  if (local_70 == plVar7) {
    local_60 = *plVar7;
    lStack_58 = plVar6[3];
    local_70 = &local_60;
  }
  else {
    local_60 = *plVar7;
  }
  local_68 = plVar6[1];
  *plVar6 = (long)plVar7;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  std::runtime_error::runtime_error(prVar4,(string *)&local_70);
  __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void mountDirectories(Container* container)
{
    std::string containerDir = container->dir;
    LOG_F(INFO, "Mounting directories: proc, sys, dev");

    if (mount("proc", "/proc", "proc", 0, nullptr) != 0)
        throw std::runtime_error("Mount /proc: FAILED [Errno " + std::to_string(errno) + "]");

    if (mount("sysfs", "/sys", "sysfs", 0, nullptr) != 0)
        throw std::runtime_error("Mount /sys: FAILED [Errno " + std::to_string(errno) + "]");

    if (mount("tmpfs", "/dev", "tmpfs", MS_NOSUID | MS_STRICTATIME, nullptr) != 0)
        throw std::runtime_error("Mount /dev: FAILED [Errno " + std::to_string(errno) + "]");

    LOG_F(INFO, "Mounting directories: SUCCESS");
}